

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O3

void __thiscall
TPZManVector<TPZFMatrix<double>_*,_10>::~TPZManVector(TPZManVector<TPZFMatrix<double>_*,_10> *this)

{
  TPZFMatrix<double> **ppTVar1;
  
  ppTVar1 = (this->super_TPZVec<TPZFMatrix<double>_*>).fStore;
  if (ppTVar1 == this->fExtAlloc) {
    (this->super_TPZVec<TPZFMatrix<double>_*>).fStore = (TPZFMatrix<double> **)0x0;
    (this->super_TPZVec<TPZFMatrix<double>_*>).fNAlloc = 0;
    (this->super_TPZVec<TPZFMatrix<double>_*>)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0196b590;
  }
  else {
    (this->super_TPZVec<TPZFMatrix<double>_*>).fNAlloc = 0;
    (this->super_TPZVec<TPZFMatrix<double>_*>)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0196b590;
    if (ppTVar1 != (TPZFMatrix<double> **)0x0) {
      operator_delete__(ppTVar1);
      return;
    }
  }
  return;
}

Assistant:

TPZManVector< T, NumExtAlloc >::~TPZManVector() {
    if (this->fStore == fExtAlloc) {
        this->fStore = nullptr;
    }
    this->fNAlloc = 0;
}